

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RNEMD.cpp
# Opt level: O0

void __thiscall
OpenMD::RNEMD::RNEMD::setAngularMomentumFluxVector
          (RNEMD *this,vector<double,_std::allocator<double>_> *angularMomentumFluxVector)

{
  value_type vVar1;
  size_type sVar2;
  const_reference pvVar3;
  double *pdVar4;
  vector<double,_std::allocator<double>_> *in_RSI;
  long in_RDI;
  
  sVar2 = std::vector<double,_std::allocator<double>_>::size(in_RSI);
  if (sVar2 != 3) {
    sVar2 = std::vector<double,_std::allocator<double>_>::size(in_RSI);
    snprintf(painCave.errMsg,2000,
             "RNEMD: Incorrect number of parameters specified for angularMomentumFluxVector.\n\tthere should be 3 parameters, but %zu were specified.\n"
             ,sVar2);
    painCave.isFatal = 1;
    simError();
  }
  pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](in_RSI,0);
  vVar1 = *pvVar3;
  pdVar4 = Vector3<double>::x((Vector3<double> *)(in_RDI + 0x1c98));
  *pdVar4 = vVar1;
  pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](in_RSI,1);
  vVar1 = *pvVar3;
  pdVar4 = Vector3<double>::y((Vector3<double> *)(in_RDI + 0x1c98));
  *pdVar4 = vVar1;
  pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](in_RSI,2);
  vVar1 = *pvVar3;
  pdVar4 = Vector3<double>::z((Vector3<double> *)(in_RDI + 0x1c98));
  *pdVar4 = vVar1;
  return;
}

Assistant:

void RNEMD::setAngularMomentumFluxVector(
      const std::vector<RealType>& angularMomentumFluxVector) {
    if (angularMomentumFluxVector.size() != 3) {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "RNEMD: Incorrect number of parameters specified for "
               "angularMomentumFluxVector.\n"
               "\tthere should be 3 parameters, but %zu were specified.\n",
               angularMomentumFluxVector.size());
      painCave.isFatal = 1;
      simError();
    }

    angularMomentumFluxVector_.x() = angularMomentumFluxVector[0];
    angularMomentumFluxVector_.y() = angularMomentumFluxVector[1];
    angularMomentumFluxVector_.z() = angularMomentumFluxVector[2];
  }